

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O3

size_t __thiscall
webrtc::WavReader::ReadSamples(WavReader *this,size_t num_samples,int16_t *samples)

{
  int iVar1;
  size_t sVar2;
  string *result;
  ulong uVar3;
  ostream *poVar4;
  size_t *v2;
  size_t read;
  size_t local_198;
  FatalMessage local_190;
  
  if (this->num_samples_remaining_ < num_samples) {
    num_samples = this->num_samples_remaining_;
  }
  sVar2 = fread(samples,2,num_samples,(FILE *)this->file_handle_);
  local_198 = sVar2;
  if (sVar2 != num_samples) {
    iVar1 = feof((FILE *)this->file_handle_);
    if (iVar1 == 0) {
      rtc::FatalMessage::FatalMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,0x58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_190,"Check failed: read == num_samples || feof(file_handle_)",
                 0x37);
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&local_190);
      std::operator<<(poVar4,"# ");
      rtc::FatalMessage::~FatalMessage(&local_190);
    }
  }
  v2 = &this->num_samples_remaining_;
  uVar3 = *v2;
  if (uVar3 < sVar2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_198,v2,"read <= num_samples_remaining_");
    if (result != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,0x59,result);
      rtc::FatalMessage::~FatalMessage(&local_190);
    }
    uVar3 = *v2;
    sVar2 = local_198;
  }
  *v2 = uVar3 - sVar2;
  return sVar2;
}

Assistant:

size_t WavReader::ReadSamples(size_t num_samples, int16_t* samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to big-endian when reading from WAV file"
#endif
  // There could be metadata after the audio; ensure we don't read it.
  num_samples = std::min(num_samples, num_samples_remaining_);
  const size_t read =
      fread(samples, sizeof(*samples), num_samples, file_handle_);
  // If we didn't read what was requested, ensure we've reached the EOF.
  RTC_CHECK(read == num_samples || feof(file_handle_));
  RTC_CHECK_LE(read, num_samples_remaining_);
  num_samples_remaining_ -= read;
  return read;
}